

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O1

void bltchar(LispPTR *args)

{
  DLword *ybase;
  DLword DVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  DLword *pDVar6;
  ushort uVar7;
  sbyte sVar8;
  ushort uVar10;
  uint h;
  int iVar11;
  ulong uVar12;
  int w;
  uint *puVar13;
  uint uVar14;
  ulong uVar15;
  uint *puVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ushort uVar21;
  uint uVar22;
  uint uVar23;
  uint *puVar24;
  uint *puVar25;
  uint uVar26;
  uint uVar27;
  uint *puVar28;
  int iVar29;
  uint uVar30;
  uint local_9c;
  uint local_90;
  uint local_88;
  uint local_84;
  uint local_78;
  uint local_74;
  sbyte sVar9;
  
  uVar19 = (uint)*(ulong *)args;
  if ((*(ulong *)args & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)(uVar19 & 0xfffffff));
  }
  pDVar6 = Lisp_world;
  uVar18 = (ulong)(uVar19 & 0xfffffff);
  uVar19 = (uint)(*(ulong *)args >> 0x20);
  if ((*(ulong *)args >> 0x20 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)(uVar19 & 0xfffffff));
  }
  DVar1 = pDVar6[uVar18 + 6];
  uVar7 = -DVar1;
  if (0 < (short)DVar1) {
    uVar7 = DVar1;
  }
  DVar1 = pDVar6[uVar18 + 2];
  uVar21 = -DVar1;
  if (0 < (short)DVar1) {
    uVar21 = DVar1;
  }
  h = (uint)pDVar6[uVar18 + 8];
  if (h != 0) {
    uVar4 = *(ulong *)(args + 4);
    uVar14 = (uint)uVar4 & 0xffff;
    w = ((uint)(uVar4 >> 0x20) & 0xffff) - uVar14;
    if (0 < w) {
      ybase = Lisp_world +
              ((ulong)pDVar6[uVar18 + 1] | (ulong)(uint)(*(int *)(pDVar6 + uVar18) << 0x10));
      uVar15 = (ulong)(uVar14 >> 3) + (long)ybase;
      uVar26 = ((uint)uVar4 & 7) + ((uint)uVar15 & 3) * 8;
      local_88 = (w + uVar26) - 1 & 0x1f;
      local_90 = -1 << (~(byte)local_88 & 0x1f);
      uVar2 = pDVar6[uVar18 + 0xb];
      uVar19 = (*(ushort *)
                 ((ulong)(Lisp_world +
                         (((uint)*(undefined8 *)(args + 2) & 0xffff) +
                         *(int *)(Lisp_world + (ulong)(uVar19 & 0xfffffff) + 0x12))) ^ 2) + uVar14)
               - ((uint)((ulong)*(undefined8 *)(args + 2) >> 0x20) & 0xffff);
      ScreenLocked = 1;
      if ((int)uVar19 < 0) {
        uVar12 = -(ulong)(7 - uVar19 >> 3);
      }
      else {
        uVar12 = (ulong)(uVar19 >> 3);
      }
      uVar18 = (long)Lisp_world +
               uVar12 + ((ulong)pDVar6[uVar18 + 5] |
                        (ulong)(uint)(*(int *)(pDVar6 + uVar18 + 4) << 0x10)) * 2;
      if (h != 0) {
        local_74 = -(uint)(uVar26 == 0) | ~(-1 << (-(char)uVar26 & 0x1fU));
        uVar10 = uVar2 >> 9 & 3;
        puVar16 = (uint *)(uVar15 & 0xfffffffffffffffc);
        local_78 = local_90 & local_74;
        iVar29 = (w + uVar26 >> 5) - 1;
        puVar13 = (uint *)(uVar18 & 0xfffffffffffffffc);
        uVar19 = (uVar19 & 7) + ((uint)uVar18 & 3) * 8;
        local_84 = w + uVar19 + 0x1f & 0x1f;
        uVar20 = uVar19 - uVar26 & 0x1f;
        uVar17 = uVar26 - uVar19 & 0x1f;
        uVar30 = 0;
        local_9c = -(uint)(uVar20 == 0) | ~(-1 << (sbyte)uVar20);
        uVar27 = -(uVar2 >> 0xb & 1);
        uVar14 = h;
        do {
          uVar23 = *puVar13;
          sVar8 = (sbyte)uVar17;
          sVar9 = (sbyte)uVar20;
          if ((uVar26 < uVar19) && (0x20 - w < (int)uVar19)) {
            puVar28 = puVar13 + 2;
            uVar22 = puVar13[1] >> sVar8 & local_9c | uVar23 << sVar9;
            uVar30 = ~local_9c & puVar13[1] << sVar9;
          }
          else {
            puVar28 = puVar13 + 1;
            if (uVar26 < uVar19) {
              uVar22 = uVar23 << sVar9;
            }
            else {
              uVar22 = uVar23 >> sVar8 & local_9c;
              uVar30 = ~local_9c & uVar23 << sVar9;
            }
          }
          uVar22 = uVar22 ^ uVar27;
          puVar25 = puVar16;
          uVar23 = local_78;
          if ((int)uVar26 < 0x21 - w) {
LAB_001102a3:
            uVar3 = *puVar25;
            switch(uVar10) {
            case 1:
              uVar22 = uVar22 & uVar3;
              break;
            case 2:
              uVar22 = uVar22 | uVar3;
              break;
            case 3:
              uVar22 = uVar22 ^ uVar3;
            }
            *puVar25 = uVar3 & ~uVar23 | uVar22 & uVar23;
          }
          else {
            uVar23 = *puVar16;
            switch(uVar10) {
            case 1:
              uVar22 = uVar22 & uVar23;
              break;
            case 2:
              uVar22 = uVar22 | uVar23;
              break;
            case 3:
              uVar22 = uVar22 ^ uVar23;
            }
            *puVar16 = uVar22 & local_74 | uVar23 & ~local_74;
            puVar25 = puVar16 + 1;
            if (uVar19 == uVar26) {
              if ((uVar2 >> 0xb & 1) == 0) {
                switch(uVar10) {
                case 0:
                  if (0 < iVar29) {
                    iVar11 = iVar29 + 1;
                    do {
                      uVar23 = *puVar28;
                      puVar28 = puVar28 + 1;
                      *puVar25 = uVar23;
                      puVar25 = puVar25 + 1;
                      iVar11 = iVar11 + -1;
                    } while (1 < iVar11);
                  }
                  break;
                case 1:
                  if (0 < iVar29) {
                    iVar11 = iVar29 + 1;
                    do {
                      *puVar25 = *puVar25 & *puVar28;
                      puVar28 = puVar28 + 1;
                      puVar25 = puVar25 + 1;
                      iVar11 = iVar11 + -1;
                    } while (1 < iVar11);
                  }
                  break;
                case 2:
                  if (0 < iVar29) {
                    iVar11 = iVar29 + 1;
                    do {
                      *puVar25 = *puVar25 | *puVar28;
                      puVar28 = puVar28 + 1;
                      puVar25 = puVar25 + 1;
                      iVar11 = iVar11 + -1;
                    } while (1 < iVar11);
                  }
                  break;
                case 3:
                  if (0 < iVar29) {
                    iVar11 = iVar29 + 1;
                    do {
                      *puVar25 = *puVar25 ^ *puVar28;
                      puVar28 = puVar28 + 1;
                      puVar25 = puVar25 + 1;
                      iVar11 = iVar11 + -1;
                    } while (1 < iVar11);
                  }
                }
              }
              else {
                switch(uVar10) {
                case 0:
                  if (0 < iVar29) {
                    iVar11 = iVar29 + 1;
                    do {
                      uVar23 = *puVar28;
                      puVar28 = puVar28 + 1;
                      *puVar25 = ~uVar23;
                      puVar25 = puVar25 + 1;
                      iVar11 = iVar11 + -1;
                    } while (1 < iVar11);
                  }
                  break;
                case 1:
                  if (0 < iVar29) {
                    iVar11 = iVar29 + 1;
                    do {
                      *puVar25 = *puVar25 & ~*puVar28;
                      puVar28 = puVar28 + 1;
                      puVar25 = puVar25 + 1;
                      iVar11 = iVar11 + -1;
                    } while (1 < iVar11);
                  }
                  break;
                case 2:
                  if (0 < iVar29) {
                    iVar11 = iVar29 + 1;
                    do {
                      *puVar25 = *puVar25 | ~*puVar28;
                      puVar28 = puVar28 + 1;
                      puVar25 = puVar25 + 1;
                      iVar11 = iVar11 + -1;
                    } while (1 < iVar11);
                  }
                  break;
                case 3:
                  if (0 < iVar29) {
                    iVar11 = iVar29 + 1;
                    do {
                      uVar23 = *puVar28;
                      puVar28 = puVar28 + 1;
                      *puVar25 = ~(uVar23 ^ *puVar25);
                      puVar25 = puVar25 + 1;
                      iVar11 = iVar11 + -1;
                    } while (1 < iVar11);
                  }
                }
              }
            }
            else if ((uVar2 >> 0xb & 1) == 0) {
              switch(uVar10) {
              case 0:
                if (0 < iVar29) {
                  iVar11 = iVar29 + 1;
                  do {
                    uVar23 = *puVar28;
                    puVar28 = puVar28 + 1;
                    uVar22 = uVar23 >> sVar8 | uVar30;
                    uVar30 = uVar23 << sVar9;
                    *puVar25 = uVar22;
                    puVar25 = puVar25 + 1;
                    iVar11 = iVar11 + -1;
                  } while (1 < iVar11);
                }
                break;
              case 1:
                if (0 < iVar29) {
                  iVar11 = iVar29 + 1;
                  uVar23 = uVar30;
                  do {
                    uVar22 = *puVar28;
                    puVar28 = puVar28 + 1;
                    uVar30 = uVar22 << sVar9;
                    *puVar25 = *puVar25 & (uVar22 >> sVar8 | uVar23);
                    puVar25 = puVar25 + 1;
                    iVar11 = iVar11 + -1;
                    uVar23 = uVar30;
                  } while (1 < iVar11);
                }
                break;
              case 2:
                if (0 < iVar29) {
                  iVar11 = iVar29 + 1;
                  puVar24 = puVar25;
                  uVar23 = uVar30;
                  do {
                    uVar22 = *puVar28;
                    puVar28 = puVar28 + 1;
                    uVar30 = uVar22 << sVar9;
                    puVar25 = puVar24 + 1;
                    *puVar24 = uVar23 | *puVar24 | uVar22 >> sVar8;
                    iVar11 = iVar11 + -1;
                    puVar24 = puVar25;
                    uVar23 = uVar30;
                  } while (1 < iVar11);
                }
                break;
              case 3:
                if (0 < iVar29) {
                  iVar11 = iVar29 + 1;
                  uVar23 = uVar30;
                  do {
                    uVar22 = *puVar28;
                    puVar28 = puVar28 + 1;
                    uVar30 = uVar22 << sVar9;
                    *puVar25 = *puVar25 ^ (uVar22 >> sVar8 | uVar23);
                    puVar25 = puVar25 + 1;
                    iVar11 = iVar11 + -1;
                    uVar23 = uVar30;
                  } while (1 < iVar11);
                }
              }
            }
            else {
              switch(uVar10) {
              case 0:
                if (0 < iVar29) {
                  iVar11 = iVar29 + 1;
                  do {
                    uVar23 = *puVar28;
                    puVar28 = puVar28 + 1;
                    uVar22 = uVar23 >> sVar8 | uVar30;
                    uVar30 = uVar23 << sVar9;
                    *puVar25 = ~uVar22;
                    puVar25 = puVar25 + 1;
                    iVar11 = iVar11 + -1;
                  } while (1 < iVar11);
                }
                break;
              case 1:
                if (0 < iVar29) {
                  iVar11 = iVar29 + 1;
                  do {
                    uVar23 = *puVar28;
                    puVar28 = puVar28 + 1;
                    uVar22 = uVar23 >> sVar8 | uVar30;
                    uVar30 = uVar23 << sVar9;
                    *puVar25 = *puVar25 & ~uVar22;
                    puVar25 = puVar25 + 1;
                    iVar11 = iVar11 + -1;
                  } while (1 < iVar11);
                }
                break;
              case 2:
                if (0 < iVar29) {
                  iVar11 = iVar29 + 1;
                  do {
                    uVar23 = *puVar28;
                    puVar28 = puVar28 + 1;
                    uVar22 = uVar23 >> sVar8 | uVar30;
                    uVar30 = uVar23 << sVar9;
                    *puVar25 = *puVar25 | ~uVar22;
                    puVar25 = puVar25 + 1;
                    iVar11 = iVar11 + -1;
                  } while (1 < iVar11);
                }
                break;
              case 3:
                if (0 < iVar29) {
                  iVar11 = iVar29 + 1;
                  puVar24 = puVar25;
                  do {
                    uVar23 = *puVar28;
                    puVar28 = puVar28 + 1;
                    uVar22 = uVar23 >> sVar8 | uVar30;
                    uVar30 = uVar23 << sVar9;
                    puVar25 = puVar24 + 1;
                    *puVar24 = ~(uVar22 ^ *puVar24);
                    iVar11 = iVar11 + -1;
                    puVar24 = puVar25;
                  } while (1 < iVar11);
                }
              }
            }
            if (local_88 != 0x1f) {
              uVar22 = uVar30;
              if (local_84 <= local_88) {
                uVar22 = *puVar28 >> sVar8 & local_9c | uVar30;
              }
              uVar22 = uVar22 ^ uVar27;
              uVar23 = local_90;
              goto LAB_001102a3;
            }
          }
          uVar23 = (uint)uVar21;
          if (((uVar21 | uVar7) & 0x1f) != 0) {
            uVar23 = uVar26 + uVar21;
            uVar26 = uVar23 & 0x1f;
            local_88 = (uVar26 + w) - 1 & 0x1f;
            local_74 = -(uint)(uVar26 == 0) | ~(-1 << (-(char)uVar26 & 0x1fU));
            local_90 = -1 << (~(byte)local_88 & 0x1f);
            local_78 = local_90 & local_74;
            iVar29 = (uVar26 + w >> 5) - 1;
          }
          uVar22 = (uint)uVar7;
          if (((uVar21 | uVar7) & 0x1f) != 0) {
            uVar22 = uVar19 + uVar7;
            uVar19 = uVar22 & 0x1f;
            local_84 = w + 0x1f + uVar22 & 0x1f;
            uVar20 = uVar22 - uVar26 & 0x1f;
            uVar17 = uVar26 - uVar22 & 0x1f;
            local_9c = -(uint)(uVar20 == 0) | ~(-1 << (sbyte)uVar20);
          }
          puVar16 = puVar16 + (uVar23 >> 5);
          puVar13 = puVar13 + (uVar22 >> 5);
          bVar5 = 1 < (int)uVar14;
          uVar14 = uVar14 - 1;
        } while (bVar5);
      }
      if ((DisplayRegion68k <= ybase) && (ybase <= DISP_MAX_Address)) {
        flush_display_lineregion(uVar4 & 0xffff,ybase,w,h);
      }
      ScreenLocked = 0;
    }
  }
  return;
}

Assistant:

void bltchar(LispPTR *args)
/*      args[0] :       PILOTBBT
 *      args[1] :       DISPLAYDATA
 *      args[2] :       CHAR8CODE
 *      args[3] :       CURX
 *      args[4] :       LEFT
 *      args[5] :       RIGHT
 */
{
  PILOTBBT *pbt;
  DISPLAYDATA *dspdata;
  int base;
#ifdef REALCURSOR
  int displayflg;
#endif
  int w, h;
  int backwardflg = 0, sx, dx, srcbpl, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0;
#ifdef NEWBITBLT
  int num_gray = 0, curr_gray_line = 0;
#endif

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(((BLTC *)args)->pilotbbt);
  dspdata = (DISPLAYDATA *)NativeAligned4FromLAddr(((BLTC *)args)->displaydata);

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));

  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  srcbpl = abs(pbt->pbtsourcebpl);
  dstbpl = abs(pbt->pbtdestbpl);
  h = pbt->pbtheight;
  w = ((BLTC *)args)->right - ((BLTC *)args)->left;
  if ((h <= 0) || (w <= 0)) return;

  base = GETWORD(NativeAligned2FromLAddr(dspdata->ddoffsetscache + ((BLTC *)args)->char8code));
  sx = base + ((BLTC *)args)->left - ((BLTC *)args)->curx;
  dx = ((BLTC *)args)->left;

#ifdef REALCURSOR
  /* if displayflg != 0 then source or destination is DisplayBitMap
   * Now we consider about only destination
   */
  displayflg = cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (((BLTC *)args)->left >> 4)),
                        (((BLTC *)args)->right - ((BLTC *)args)->left), pbt->pbtheight, pbt->pbtbackward);
#endif /* REALCURSOR */

  op = pbt->pbtoperation;
  src_comp = pbt->pbtsourcetype;

  LOCKSCREEN;

#ifdef REALCURSOR
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_char_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    if (in_display_segment(dstbase)) { flush_display_lineregion(dx, dstbase, w, h); }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* SDL */

#ifdef DOS
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;
}